

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::IsImportedSharedLibWithoutSOName(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ImportInfo *pIVar3;
  
  bVar1 = IsImported(this);
  if (((bVar1) && (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) &&
     (pIVar3 = GetImportInfo(this,config), pIVar3 != (ImportInfo *)0x0)) {
    return pIVar3->NoSOName;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsImportedSharedLibWithoutSOName(
  const std::string& config) const
{
  if (this->IsImported() && this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->NoSOName;
    }
  }
  return false;
}